

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::PropagateSimpleDatePartStatistics<1l,366l>
          (duckdb *this,vector<duckdb::BaseStatistics,_true> *child_stats)

{
  reference stats;
  BaseStatistics result;
  Value VStack_c8;
  LogicalType local_88;
  BaseStatistics local_70;
  
  LogicalType::LogicalType(&local_88,BIGINT);
  NumericStats::CreateEmpty(&local_70,&local_88);
  LogicalType::~LogicalType(&local_88);
  stats = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  BaseStatistics::CopyValidity(&local_70,stats);
  Value::BIGINT(&VStack_c8,1);
  NumericStats::SetMin(&local_70,&VStack_c8);
  Value::~Value(&VStack_c8);
  Value::BIGINT(&VStack_c8,0x16e);
  NumericStats::SetMax(&local_70,&VStack_c8);
  Value::~Value(&VStack_c8);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_70);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateSimpleDatePartStatistics(vector<BaseStatistics> &child_stats) {
	// we can always propagate simple date part statistics
	// since the min and max can never exceed these bounds
	auto result = NumericStats::CreateEmpty(LogicalType::BIGINT);
	result.CopyValidity(child_stats[0]);
	NumericStats::SetMin(result, Value::BIGINT(MIN));
	NumericStats::SetMax(result, Value::BIGINT(MAX));
	return result.ToUnique();
}